

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Ptr<Catch::IStreamingReporter> __thiscall
Catch::createReporter(Catch *this,string *reporterName,Ptr<Catch::Config> *config)

{
  int iVar1;
  IRegistryHub *pIVar2;
  undefined4 extraout_var;
  long *plVar3;
  ostream *poVar4;
  domain_error *this_00;
  ostringstream oss;
  string local_1c0 [32];
  Config *local_1a0 [47];
  
  pIVar2 = getRegistryHub();
  iVar1 = (*pIVar2->_vptr_IRegistryHub[2])(pIVar2);
  local_1a0[0] = config->m_p;
  if (local_1a0[0] != (Config *)0x0) {
    (*(local_1a0[0]->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
      ._vptr_NonCopyable[2])();
  }
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x10))
                             ((long *)CONCAT44(extraout_var,iVar1),reporterName,local_1a0);
  *(long **)this = plVar3;
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 0x10))(plVar3);
  }
  if (local_1a0[0] != (Config *)0x0) {
    (*(local_1a0[0]->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
      ._vptr_NonCopyable[3])();
  }
  if (plVar3 != (long *)0x0) {
    return (Ptr<Catch::IStreamingReporter>)(IStreamingReporter *)this;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"No reporter registered with name: \'",0x23);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(reporterName->_M_dataplus)._M_p,
                      reporterName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
  this_00 = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::domain_error::domain_error(this_00,local_1c0);
  __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

Ptr<IStreamingReporter> createReporter( std::string const& reporterName, Ptr<Config> const& config ) {
        Ptr<IStreamingReporter> reporter = getRegistryHub().getReporterRegistry().create( reporterName, config.get() );
        if( !reporter ) {
            std::ostringstream oss;
            oss << "No reporter registered with name: '" << reporterName << "'";
            throw std::domain_error( oss.str() );
        }
        return reporter;
    }